

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.h
# Opt level: O1

bool __thiscall
brynet::net::WrapTcpService::
addSession<std::function<void(brynet::net::AddSessionOption::Options&)>,std::function<void(brynet::net::AddSessionOption::Options&)>>
          (WrapTcpService *this,PTR *socket,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args_1)

{
  undefined1 uVar1;
  _Any_data *p_Var2;
  long lVar3;
  initializer_list<std::function<void_(brynet::net::AddSessionOption::Options_&)>_> __l;
  allocator_type local_81;
  _Head_base<0UL,_brynet::net::TcpSocket_*,_false> local_80;
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  local_78;
  function<void_(brynet::net::AddSessionOption::Options_&)> local_60;
  _Any_data local_40;
  undefined8 local_30 [2];
  
  local_80._M_head_impl =
       (socket->_M_t).
       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
       super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
  (socket->_M_t).
  super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
  super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
  super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function(&local_60,args);
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function
            ((function<void_(brynet::net::AddSessionOption::Options_&)> *)&local_40,args_1);
  __l._M_len = 2;
  __l._M_array = &local_60;
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::vector(&local_78,__l,&local_81);
  uVar1 = brynet::net::WrapTcpService::_addSession(this,&local_80,&local_78);
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::~vector(&local_78);
  lVar3 = -0x40;
  p_Var2 = &local_40;
  do {
    if (*(code **)(p_Var2 + 1) != (code *)0x0) {
      (**(code **)(p_Var2 + 1))(p_Var2,p_Var2,__destroy_functor);
    }
    p_Var2 = p_Var2 + -2;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if (local_80._M_head_impl != (TcpSocket *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
  return (bool)uVar1;
}

Assistant:

bool                        addSession(TcpSocket::PTR socket, const Args& ... args)
            {
                return _addSession(std::move(socket), { args... });
            }